

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

cio_error write_response(cio_http_client *client,cio_http_status_code status_code,
                        cio_write_buffer *wbh_body,cio_response_written_cb_t written_cb)

{
  int iVar1;
  cio_error cVar2;
  cio_http_server *server_00;
  cio_error err;
  cio_http_server *server;
  size_t sStack_38;
  int written;
  size_t content_length;
  cio_response_written_cb_t written_cb_local;
  cio_write_buffer *wbh_body_local;
  cio_http_status_code status_code_local;
  cio_http_client *client_local;
  
  if (((client->http_private).response_written & 1U) == 0) {
    client->response_written_cb = written_cb;
    (client->http_private).response_fired = true;
    sStack_38 = 0;
    if (wbh_body != (cio_write_buffer *)0x0) {
      sStack_38 = cio_write_buffer_get_total_size(wbh_body);
    }
    iVar1 = snprintf((client->http_private).content_length_buffer,0x1d,"Content-Length: %zu\r\n",
                     sStack_38);
    cio_write_buffer_element_init
              (&(client->http_private).wb_http_content_length,
               (client->http_private).content_length_buffer,(long)iVar1);
    add_response_header(client,&(client->http_private).wb_http_content_length);
    if (((status_code == CIO_HTTP_STATUS_BAD_REQUEST) || (status_code == CIO_HTTP_STATUS_TIMEOUT))
       || (status_code == CIO_HTTP_STATUS_INTERNAL_SERVER_ERROR)) {
      (client->http_private).close_immediately = true;
    }
    server_00 = cio_http_client_get_server(client);
    cVar2 = cio_timer_expires_from_now
                      (&(client->http_private).response_timer,server_00->response_timeout_ns,
                       client_timeout_handler,client);
    if (cVar2 == CIO_SUCCESS) {
      start_response_header(client,status_code);
      end_response_header(client);
      if (wbh_body != (cio_write_buffer *)0x0) {
        cio_write_buffer_splice(wbh_body,&client->response_wbh);
      }
      (client->http_private).response_written = true;
      client_local._4_4_ = flush(client,response_written);
    }
    else {
      cio_write_buffer_unlink(&client->response_wbh,&(client->http_private).wb_http_content_length);
      handle_error(server_00,"Arming of response timer failed!");
      mark_to_be_closed(client);
      client_local._4_4_ = CIO_SUCCESS;
    }
  }
  else {
    client_local._4_4_ = CIO_OPERATION_NOT_PERMITTED;
  }
  return client_local._4_4_;
}

Assistant:

static enum cio_error write_response(struct cio_http_client *client, enum cio_http_status_code status_code, struct cio_write_buffer *wbh_body, cio_response_written_cb_t written_cb)
{
	if (cio_unlikely(client->http_private.response_written)) {
		return CIO_OPERATION_NOT_PERMITTED;
	}

	client->response_written_cb = written_cb;
	client->http_private.response_fired = true;
	size_t content_length = 0;
	if (wbh_body) {
		content_length = cio_write_buffer_get_total_size(wbh_body);
	}

	int written = snprintf(client->http_private.content_length_buffer, sizeof(client->http_private.content_length_buffer) - 1, "Content-Length: %zu" CIO_CRLF, content_length);
	cio_write_buffer_element_init(&client->http_private.wb_http_content_length, client->http_private.content_length_buffer, (size_t)written);
	add_response_header(client, &client->http_private.wb_http_content_length);

	if ((status_code == CIO_HTTP_STATUS_BAD_REQUEST) || (status_code == CIO_HTTP_STATUS_TIMEOUT) || (status_code == CIO_HTTP_STATUS_INTERNAL_SERVER_ERROR)) {
		client->http_private.close_immediately = true;
	}

	struct cio_http_server *server = cio_http_client_get_server(client);
	enum cio_error err = cio_timer_expires_from_now(&client->http_private.response_timer, server->response_timeout_ns, client_timeout_handler, client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		cio_write_buffer_unlink(&client->response_wbh, &client->http_private.wb_http_content_length);
		handle_error(server, "Arming of response timer failed!");
		mark_to_be_closed(client);
		return 0;
	}

	start_response_header(client, status_code);
	end_response_header(client);
	if (wbh_body) {
		cio_write_buffer_splice(wbh_body, &client->response_wbh);
	}

	client->http_private.response_written = true;
	return flush(client, response_written);
}